

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

bool __thiscall
helics::BrokerBase::sendToLogger
          (BrokerBase *this,GlobalFederateId federateID,int logLevel,string_view name,
          string_view message,bool fromRemote)

{
  bool bVar1;
  baseType bVar2;
  string *__str;
  size_t sVar3;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  double t;
  string_view fmt;
  string_view fmt_00;
  string_view header_00;
  format_args args;
  format_args args_00;
  string_view name_local;
  string header;
  string timeString;
  string local_88;
  string local_68;
  pointer local_48;
  size_type sStack_40;
  
  aVar4._1_7_ = in_register_00000089;
  aVar4._0_1_ = fromRemote;
  name_local._M_str = name._M_str;
  sVar3 = name._M_len;
  name_local._M_len = sVar3;
  if (((this->global_id)._M_i.gid == federateID.gid) &&
     ((sVar3 == 0 || (name_local._M_str[sVar3 - 1] != ']')))) {
    header._M_dataplus._M_p = (pointer)&header.field_2;
    header.field_2._M_local_buf[0] = '\0';
    header._M_string_length = 0;
    timeString._M_dataplus._M_p = (pointer)&timeString.field_2;
    timeString._M_string_length = 0;
    timeString.field_2._M_local_buf[0] = '\0';
    (*this->_vptr_BrokerBase[9])(this);
    bVar2 = count_time<9,_long>::convert(t);
    if (bVar2 + 0x8000000000000001U < 0x7fffa62ce68c1002) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&timeString,'[');
      __str = brokerStateName_abi_cxx11_((this->brokerState)._M_i);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&timeString,__str);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&timeString,']');
      sVar3 = name_local._M_len;
    }
    else {
      local_88._M_dataplus._M_p =
           (pointer)((double)(bVar2 % 1000000000) * 1e-09 + (double)(bVar2 / 1000000000));
      fmt.size_ = 10;
      fmt.data_ = (char *)0x6;
      args.field_1.values_ = aVar4.values_;
      args.desc_ = (unsigned_long_long)&local_88;
      ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"[t={}]",fmt,args);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&timeString,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    local_68._M_dataplus._M_p = name_local._M_str;
    local_48 = timeString._M_dataplus._M_p;
    sStack_40 = timeString._M_string_length;
    fmt_00.size_ = 0xd1d;
    fmt_00.data_ = (char *)0x9;
    args_00.field_1.args_ = aVar4.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    local_68._M_string_length = sVar3;
    local_68.field_2._M_allocated_capacity._0_4_ = federateID.gid;
    ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"{} ({}){}",fmt_00,args_00);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&timeString);
  }
  else {
    header._M_dataplus._M_p = (pointer)&header.field_2;
    header.field_2._M_local_buf[0] = '\0';
    header._M_string_length = 0;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&header,&name_local);
  }
  header_00._M_str = header._M_dataplus._M_p;
  header_00._M_len = header._M_string_length;
  bVar1 = LogManager::sendToLogger
                    ((this->mLogManager).
                     super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     logLevel,header_00,message,fromRemote);
  std::__cxx11::string::~string((string *)&header);
  return bVar1;
}

Assistant:

bool BrokerBase::sendToLogger(GlobalFederateId federateID,
                              int logLevel,
                              std::string_view name,
                              std::string_view message,
                              bool fromRemote) const
{
    const bool noID = (federateID != global_id.load()) || (!name.empty() && name.back() == ']');

    std::string header;
    if (noID) {
        header = name;
    } else {
        std::string timeString;

        const Time currentTime = getSimulationTime();
        if (currentTime <= mInvalidSimulationTime || currentTime >= cHelicsBigNumber) {
            timeString.push_back('[');
            timeString.append(brokerStateName(getBrokerState()));
            timeString.push_back(']');
        } else {
            timeString = fmt::format("[t={}]", static_cast<double>(currentTime));
        }
        header = fmt::format("{} ({}){}", name, federateID.baseValue(), timeString);
    }
    return mLogManager->sendToLogger(logLevel, header, message, fromRemote);
}